

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall
crnlib::crn_comp::optimize_alpha_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  vector<unsigned_short> *this_00;
  unsigned_short *puVar7;
  long lVar8;
  long lVar9;
  level_details *plVar10;
  endpoint_indices_details *peVar11;
  uint16 i;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int back;
  uint uVar16;
  uchar *puVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  ushort *puVar23;
  byte bVar24;
  int scale;
  uint16 i_2;
  uint uVar25;
  uint size;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  float fVar30;
  ushort local_180;
  ushort local_17e;
  float local_17c;
  vector<unsigned_int> hist;
  static_huffman_data_model dm;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  symbol_codec codec;
  
  this_00 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar4 = *(ushort *)((long)pData_ptr + 0x10);
  uVar26 = (ulong)uVar4;
  vector<unsigned_short>::resize(this_00,(uint)uVar4,false);
  uVar16 = (uint)uVar4;
  size = (uint)uVar4;
  if (data == 0) {
    lVar8 = *pData_ptr;
    vector<unsigned_short>::resize(this_00,(uint)uVar4,false);
    vector<crnlib::optimize_alpha_params::unpacked_endpoint>::vector
              ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&codec,uVar16);
    vector<unsigned_short>::vector((vector<unsigned_short> *)&dm,uVar16);
    for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
      *(undefined2 *)(codec.m_pDecode_buf + uVar15 * 2) = *(undefined2 *)(lVar8 + uVar15 * 2);
      *(short *)(dm._0_8_ + uVar15 * 2) = (short)uVar15;
    }
    bVar24 = 0;
    bVar22 = 0;
    uVar15 = uVar26;
    while (uVar21 = uVar15 - 1, uVar15 != 0) {
      uVar16 = 0;
      uVar13 = 0xffffffff;
      for (uVar29 = 0; uVar15 != uVar29; uVar29 = uVar29 + 1) {
        uVar19 = ((uint)codec.m_pDecode_buf[uVar29 * 2 + 1] - (uint)bVar24) *
                 ((uint)codec.m_pDecode_buf[uVar29 * 2 + 1] - (uint)bVar24) +
                 ((uint)codec.m_pDecode_buf[uVar29 * 2] - (uint)bVar22) *
                 ((uint)codec.m_pDecode_buf[uVar29 * 2] - (uint)bVar22);
        if (uVar19 < uVar13) {
          uVar16 = (uint)uVar29;
          uVar13 = uVar19;
        }
      }
      uVar29 = (ulong)((uVar16 & 0xffff) * 2);
      bVar22 = codec.m_pDecode_buf[uVar29];
      bVar24 = codec.m_pDecode_buf[uVar29 + 1];
      this_00->m_p[*(ushort *)(dm._0_8_ + uVar29)] = uVar4 - (short)uVar15;
      *(undefined2 *)(codec.m_pDecode_buf + uVar29) =
           *(undefined2 *)(codec.m_pDecode_buf + uVar21 * 2);
      *(undefined2 *)(dm._0_8_ + uVar29) = *(undefined2 *)(dm._0_8_ + uVar21 * 2);
      uVar15 = uVar21;
    }
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&dm);
    vector<crnlib::optimize_alpha_params::unpacked_endpoint>::~vector
              ((vector<crnlib::optimize_alpha_params::unpacked_endpoint> *)&codec);
    optimize_alpha_selectors(this);
  }
  else {
    puVar7 = this_00->m_p;
    lVar8 = *pData_ptr;
    lVar9 = *(long *)((long)pData_ptr + 8);
    uVar5 = *(ushort *)((long)pData_ptr + 0x12);
    local_17c = *(float *)((long)pData_ptr + 0x14);
    codec.m_pDecode_buf = (uint8 *)0x0;
    codec.m_pDecode_buf_next = (uint8 *)0x0;
    dm.m_total_syms = 0;
    dm._4_4_ = 0;
    dm.m_codes.m_p = (unsigned_short *)0x0;
    local_180 = uVar5;
    vector<unsigned_int>::vector(&hist,(uint)uVar4);
    vector<unsigned_short>::push_back((vector<unsigned_short> *)&codec,&local_180);
    for (local_17e = 0; local_17e < uVar4; local_17e = local_17e + 1) {
      if (local_17e != local_180) {
        vector<unsigned_short>::push_back((vector<unsigned_short> *)&dm,&local_17e);
        hist.m_p[local_17e] = *(uint *)(lVar9 + (ulong)(uVar5 * uVar16) * 4 + (ulong)local_17e * 4);
      }
    }
    fVar30 = local_17c * 1000.0;
    local_17c = 0.0;
    while ((uint)dm.m_codes.m_p != 0) {
      uVar16 = (int)codec.m_pDecode_buf_next - 1;
      uVar15 = (ulong)uVar16;
      local_110 = 0;
      local_118 = 0;
      uVar21 = 0;
      local_120 = 0;
      for (uVar29 = 0; (uint)dm.m_codes.m_p != uVar29; uVar29 = uVar29 + 1) {
        uVar28 = (ulong)*(ushort *)(dm._0_8_ + uVar29 * 2);
        uVar19 = (uint)*(byte *)(lVar8 + uVar28 * 2);
        iVar27 = uVar19 - *(byte *)(lVar8 + (ulong)*(ushort *)codec.m_pDecode_buf * 2);
        bVar22 = *(byte *)(lVar8 + 1 + uVar28 * 2);
        iVar12 = (uint)bVar22 -
                 (uint)*(byte *)(lVar8 + 1 + (ulong)*(ushort *)codec.m_pDecode_buf * 2);
        uVar13 = iVar12 * iVar12 + iVar27 * iVar27;
        if (999 < uVar13) {
          uVar13 = 1000;
        }
        iVar12 = uVar19 - *(byte *)(lVar8 + (ulong)*(ushort *)(codec.m_pDecode_buf + uVar15 * 2) * 2
                                   );
        iVar27 = (uint)bVar22 -
                 (uint)*(byte *)(lVar8 + 1 +
                                (ulong)*(ushort *)(codec.m_pDecode_buf + uVar15 * 2) * 2);
        uVar19 = iVar27 * iVar27 + iVar12 * iVar12;
        if (999 < uVar19) {
          uVar19 = 1000;
        }
        iVar12 = (int)(long)(fVar30 + 1000.0);
        uVar18 = (ulong)(iVar12 - uVar13);
        uVar14 = (ulong)(iVar12 - uVar19);
        uVar20 = uVar14;
        if (uVar14 < uVar18) {
          uVar20 = uVar18;
        }
        uVar20 = (hist.m_p[uVar28] + (int)local_17c) * uVar20;
        if (uVar21 <= uVar20) {
          uVar21 = uVar20 + 1;
          local_120 = uVar29 & 0xffffffff;
          local_118 = uVar14;
          local_110 = uVar18;
        }
      }
      local_180 = *(ushort *)(dm._0_8_ + (local_120 & 0xffff) * 2);
      local_17c = (float)hist.m_p[local_180];
      lVar1 = lVar9 + (ulong)(local_180 * size) * 4;
      uVar19 = 0;
      uVar13 = 0;
      puVar23 = (ushort *)codec.m_pDecode_buf;
      for (; 0 < (int)uVar16; uVar16 = uVar16 - 2) {
        uVar19 = uVar19 + *(int *)(lVar1 + (ulong)*puVar23 * 4) * uVar16;
        uVar13 = uVar13 + *(int *)(lVar1 + (ulong)*(ushort *)(codec.m_pDecode_buf + uVar15 * 2) * 4)
                          * uVar16;
        uVar15 = (ulong)((int)uVar15 - 1);
        puVar23 = puVar23 + 1;
      }
      if (local_110 * uVar19 < local_118 * uVar13 || local_110 * uVar19 - local_118 * uVar13 == 0) {
        vector<unsigned_short>::push_back((vector<unsigned_short> *)&codec,&local_180);
      }
      else {
        vector<unsigned_short>::push_front((vector<unsigned_short> *)&codec,&local_180);
      }
      vector<unsigned_short>::erase
                ((vector<unsigned_short> *)&dm,
                 (unsigned_short *)((ulong)((uint)(ushort)local_120 * 2) + dm._0_8_));
      uVar15 = 0;
      while( true ) {
        uVar16 = (uint)(uVar15 & 0xffff);
        if ((uint)dm.m_codes.m_p <= uVar16) break;
        uVar15 = (ulong)*(ushort *)(dm._0_8_ + (uVar15 & 0xffff) * 2);
        hist.m_p[uVar15] = hist.m_p[uVar15] + *(int *)(lVar1 + uVar15 * 4);
        uVar15 = (ulong)(uVar16 + 1);
      }
    }
    for (uVar15 = 0; uVar26 != uVar15; uVar15 = uVar15 + 1) {
      puVar7[*(ushort *)(codec.m_pDecode_buf + uVar15 * 2)] = (unsigned_short)uVar15;
    }
    vector<unsigned_int>::~vector(&hist);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&dm);
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&codec);
  }
  pack_alpha_endpoints
            (this,(vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10),this_00);
  iVar12 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  vector<unsigned_int>::vector(&hist,size);
  bVar2 = this->m_has_comp[1];
  bVar3 = this->m_has_comp[2];
  for (uVar15 = 0; uVar15 < (this->m_levels).m_size; uVar15 = uVar15 + 1) {
    plVar10 = (this->m_levels).m_p;
    uVar16 = plVar10[uVar15].first_block;
    uVar6 = plVar10[uVar15].num_blocks;
    uVar19 = 0;
    uVar13 = 0;
    for (uVar21 = (ulong)uVar16; uVar21 < uVar6 + uVar16; uVar21 = uVar21 + 1) {
      uVar25 = uVar13;
      if ((bVar2 != false) &&
         (peVar11 = (this->m_endpoint_indices).m_p,
         uVar25 = (uint)this_00->m_p[peVar11[uVar21].field_0.field_0.alpha0],
         peVar11[uVar21].reference == '\0')) {
        hist.m_p[((int)(uVar25 - uVar13) >> 0x1f & size) + (uVar25 - uVar13)] =
             hist.m_p[((int)(uVar25 - uVar13) >> 0x1f & size) + (uVar25 - uVar13)] + 1;
      }
      uVar13 = uVar25;
      uVar25 = uVar19;
      if (bVar3 != false) {
        peVar11 = (this->m_endpoint_indices).m_p;
        uVar4 = this_00->m_p[peVar11[uVar21].field_0.field_0.alpha1];
        uVar25 = (uint)uVar4;
        if (peVar11[uVar21].reference == '\0') {
          hist.m_p[((int)(uVar4 - uVar19) >> 0x1f & size) + (uVar4 - uVar19)] =
               hist.m_p[((int)(uVar4 - uVar19) >> 0x1f & size) + (uVar4 - uVar19)] + 1;
        }
      }
      uVar19 = uVar25;
    }
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  uVar15 = 0;
  puVar17 = (uchar *)0x0;
  if (dm.m_code_sizes.m_size != 0) {
    puVar17 = dm.m_code_sizes.m_p;
  }
  iVar12 = iVar12 << 3;
  for (; uVar26 != uVar15; uVar15 = uVar15 + 1) {
    iVar12 = iVar12 + (uint)puVar17[uVar15] * hist.m_p[uVar15];
  }
  symbol_codec::symbol_codec(&codec);
  symbol_codec::start_encoding(&codec,0x10000);
  codec.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&codec,&dm,false,(static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&codec,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar12 + codec.m_total_bits_written;
  crnlib_delete<crnlib::optimize_alpha_params>((optimize_alpha_params *)pData_ptr);
  symbol_codec::~symbol_codec(&codec);
  static_huffman_data_model::~static_huffman_data_model(&dm);
  vector<unsigned_int>::~vector(&hist);
  return;
}

Assistant:

void crn_comp::optimize_alpha_endpoints_task(uint64 data, void* pData_ptr) {
  optimize_alpha_params* pParams = reinterpret_cast<optimize_alpha_params*>(pData_ptr);
  crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
  uint16 n = pParams->n;
  remapping.resize(n);

  if (data) {
    remap_alpha_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
  } else {
    sort_alpha_endpoints(remapping, pParams->unpacked_endpoints, n);
    optimize_alpha_selectors();
  }

  pack_alpha_endpoints(pParams->pResult->packed_endpoints, remapping);
  uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

  crnlib::vector<uint> hist(n);
  bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
  for (uint level = 0; level < m_levels.size(); level++) {
    for (uint alpha0_index = 0, alpha1_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++) {
      if (hasAlpha0) {
        uint index = remapping[m_endpoint_indices[b].component[cAlpha0]];
        if (!m_endpoint_indices[b].reference) {
          int sym = index - alpha0_index;
          hist[sym < 0 ? sym + n : sym]++;
        }
        alpha0_index = index;
      }
      if (hasAlpha1) {
        uint index = remapping[m_endpoint_indices[b].component[cAlpha1]];
        if (!m_endpoint_indices[b].reference) {
          int sym = index - alpha1_index;
          hist[sym < 0 ? sym + n : sym]++;
        }
        alpha1_index = index;
      }
    }
  }

  static_huffman_data_model dm;
  dm.init(true, n, hist.get_ptr(), 16);
  const uint8* code_sizes = dm.get_code_sizes();
  for (uint16 s = 0; s < n; s++)
    total_bits += hist[s] * code_sizes[s];

  symbol_codec codec;
  codec.start_encoding(64 * 1024);
  codec.encode_enable_simulation(true);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  codec.stop_encoding(false);
  total_bits += codec.encode_get_total_bits_written();

  pParams->pResult->total_bits = total_bits;

  crnlib_delete(pParams);
}